

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.hh
# Opt level: O0

void __thiscall
TokenSplit::tagLabel(TokenSplit *this,char *ptr,syntax_highlight h,AddrSpace *s,uintb o)

{
  int4 iVar1;
  uintb o_local;
  AddrSpace *s_local;
  syntax_highlight h_local;
  char *ptr_local;
  TokenSplit *this_local;
  
  std::__cxx11::string::operator=((string *)&this->tok,ptr);
  iVar1 = std::__cxx11::string::size();
  this->size = iVar1;
  (this->ptr_second).spc = s;
  this->off = o;
  this->tagtype = label_t;
  this->delimtype = tokenstring;
  this->hl = h;
  return;
}

Assistant:

void tagLabel(const char *ptr,EmitXml::syntax_highlight h,
		 const AddrSpace *s,uintb o) {
    tok = ptr; size = tok.size(); ptr_second.spc=s; off=o;
    tagtype=label_t; delimtype=tokenstring; hl=h; }